

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O2

uint __thiscall
KarpRabinHash<unsigned_int,unsigned_char>::
hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (KarpRabinHash<unsigned_int,unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  uint j;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  puVar2 = (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  uVar1 = *(uint *)(this + 0x40c);
  uVar8 = 0;
  uVar5 = 0;
  while( true ) {
    uVar6 = (ulong)uVar5;
    if (uVar3 <= uVar6) break;
    uVar7 = 1;
    for (uVar4 = 0; uVar4 < ~uVar6 + uVar3; uVar4 = (ulong)((int)uVar4 + 1)) {
      uVar7 = uVar7 * 0x25 & uVar1;
    }
    uVar8 = (uVar7 * *(int *)(this + (ulong)puVar2[uVar6] * 4 + 0xc) & uVar1) + uVar8 & uVar1;
    uVar5 = uVar5 + 1;
  }
  return uVar8;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      hashvaluetype x(1);
      for (uint j = 0; j < c.size() - 1 - k; ++j) {
        x = (x * B) & HASHMASK;
      }
      x = (x * hasher.hashvalues[c[k]]) & HASHMASK;
      answer = (answer + x) & HASHMASK;
    }
    return answer;
  }